

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_poc(opj_j2k_t *j2k)

{
  int b;
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  unsigned_long_long v;
  long in_RDI;
  opj_poc_t *poc;
  opj_cio_t *cio;
  opj_tccp_t *tccp;
  opj_tcp_t *tcp;
  opj_cp_t *cp;
  int numcomps;
  int i;
  int numpchgs;
  int len;
  int in_stack_ffffffffffffffbc;
  unsigned_long_long in_stack_ffffffffffffffc0;
  opj_cio_t *cio_00;
  int local_14;
  
  b = *(int *)(*(long *)(in_RDI + 0x58) + 0x10);
  lVar4 = *(long *)(*(long *)(in_RDI + 0x60) + 0x80) + (long)*(int *)(in_RDI + 0xc) * 0x15e8;
  lVar2 = *(long *)(lVar4 + 0x15e0);
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  iVar1 = *(int *)(lVar4 + 0x1a4);
  cio_write(cio_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  cio_write(cio_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  for (local_14 = 0; local_14 < iVar1 + 1; local_14 = local_14 + 1) {
    v = lVar4 + 0x1ac + (long)local_14 * 0x94;
    cio_write(cio_00,v,in_stack_ffffffffffffffbc);
    cio_write(cio_00,v,in_stack_ffffffffffffffbc);
    cio_write(cio_00,v,in_stack_ffffffffffffffbc);
    iVar3 = int_min(*(int *)(v + 8),*(int *)(lVar4 + 0xc));
    *(int *)(v + 8) = iVar3;
    cio_write(cio_00,v,in_stack_ffffffffffffffbc);
    iVar3 = int_min(*(int *)(v + 0xc),*(int *)(lVar2 + 4));
    *(int *)(v + 0xc) = iVar3;
    cio_write(cio_00,v,in_stack_ffffffffffffffbc);
    iVar3 = int_min(*(int *)(v + 0x10),b);
    *(int *)(v + 0x10) = iVar3;
    cio_write(cio_00,v,in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

static void j2k_write_poc(opj_j2k_t *j2k) {
	int len, numpchgs, i;

	int numcomps = j2k->image->numcomps;
	
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_cio_t *cio = j2k->cio;

	numpchgs = 1 + tcp->numpocs;
	cio_write(cio, J2K_MS_POC, 2);	/* POC  */
	len = 2 + (5 + 2 * (numcomps <= 256 ? 1 : 2)) * numpchgs;
	cio_write(cio, len, 2);		/* Lpoc */
	for (i = 0; i < numpchgs; i++) {
		opj_poc_t *poc = &tcp->pocs[i];
		cio_write(cio, poc->resno0, 1);	/* RSpoc_i */
		cio_write(cio, poc->compno0, (numcomps <= 256 ? 1 : 2));	/* CSpoc_i */
		cio_write(cio, poc->layno1, 2);	/* LYEpoc_i */
		poc->layno1 = int_min(poc->layno1, tcp->numlayers);
		cio_write(cio, poc->resno1, 1);	/* REpoc_i */
		poc->resno1 = int_min(poc->resno1, tccp->numresolutions);
		cio_write(cio, poc->compno1, (numcomps <= 256 ? 1 : 2));	/* CEpoc_i */
		poc->compno1 = int_min(poc->compno1, numcomps);
		cio_write(cio, poc->prg, 1);	/* Ppoc_i */
	}
}